

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O1

void test_common<unsigned_char>(uint length,uchar value)

{
  ulong __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  uint i;
  int iVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr<unsigned_char> pa;
  shared_ptr<unsigned_char> pb;
  
  __n = (ulong)length;
  iVar2 = posix_memalign(&pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,0x10,(long)(int)(length + 1));
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar2 == 0) {
    local_50 = pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,void(*)(unsigned_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa,local_50,
             sse::common::free<unsigned_char>);
  iVar2 = posix_memalign(&local_58,0x10,(long)(int)(length + 1));
  pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar2 == 0) {
    pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_58;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,void(*)(unsigned_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb,
             pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<unsigned_char>);
  __s._M_pi = pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var1 = local_50;
  *(undefined1 *)((long)&local_50->_vptr__Sp_counted_base + __n) = 0x7f;
  *(undefined1 *)
   ((long)&(pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + __n) = 0x3f;
  if (0 < (int)length) {
    memset(local_50,(uint)value,__n);
  }
  if (length != 0) {
    lVar3 = 0;
    do {
      if (*(uchar *)((long)&p_Var1->_vptr__Sp_counted_base + lVar3) != value) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
        *(undefined4 *)(puVar5 + 1) = 0x16;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar3 = lVar3 + 1;
    } while (length != (uint)lVar3);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(undefined1 *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar4) =
           *(undefined1 *)((long)&p_Var1->_vptr__Sp_counted_base + uVar4);
      uVar4 = uVar4 + 1;
    } while (__n != uVar4);
  }
  if (length != 0) {
    lVar3 = 0;
    do {
      if (*(uchar *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + lVar3) != value) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
        *(undefined4 *)(puVar5 + 1) = 0x1d;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar3 = lVar3 + 1;
    } while (length != (uint)lVar3);
  }
  if (0 < (int)length) {
    memset(__s._M_pi,0,__n);
  }
  if (length != 0) {
    lVar3 = 0;
    do {
      if (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + lVar3) != '\0') {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
        *(undefined4 *)(puVar5 + 1) = 0x24;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar3 = lVar3 + 1;
    } while (length != (uint)lVar3);
    uVar4 = 0;
    do {
      *(char *)((long)&p_Var1->_vptr__Sp_counted_base + uVar4) = (char)uVar4;
      uVar4 = uVar4 + 1;
    } while (__n != uVar4);
  }
  if (0 < (int)length) {
    uVar4 = 0;
    do {
      *(undefined1 *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar4) =
           *(undefined1 *)((long)&p_Var1->_vptr__Sp_counted_base + uVar4);
      uVar4 = uVar4 + 1;
    } while (__n != uVar4);
  }
  if (length != 0) {
    lVar3 = 0;
    do {
      if ((char)lVar3 != *(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + lVar3)) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
        *(undefined4 *)(puVar5 + 1) = 0x2d;
        *(uint *)((long)puVar5 + 0xc) = length;
        __cxa_throw(puVar5,&Exception::typeinfo,0);
      }
      lVar3 = lVar3 + 1;
    } while (length != (uint)lVar3);
  }
  if ((*(char *)((long)&p_Var1->_vptr__Sp_counted_base + __n) == '\x7f') &&
     (*(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + __n) == '?')) {
    if (pb.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pb.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 pa.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar5 = "void test_common(unsigned int, T) [T = unsigned char]";
  *(undefined4 *)(puVar5 + 1) = 0x31;
  *(uint *)((long)puVar5 + 0xc) = length;
  __cxa_throw(puVar5,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}